

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerSettings.cpp
# Opt level: O0

char * __thiscall HD44780AnalyzerSettings::SaveSettings(HD44780AnalyzerSettings *this)

{
  char *pcVar1;
  uint local_1c;
  SimpleArchive local_18 [4];
  U32 dbline;
  SimpleArchive text_archive;
  HD44780AnalyzerSettings *this_local;
  
  _text_archive = this;
  SimpleArchive::SimpleArchive(local_18);
  SimpleArchive::operator<<(local_18,"SaleaeHD44780Analyzer");
  SimpleArchive::operator<<(local_18,1);
  SimpleArchive::operator<<(local_18,&this->mEChannel);
  SimpleArchive::operator<<(local_18,&this->mRSChannel);
  SimpleArchive::operator<<(local_18,&this->mRWChannel);
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    SimpleArchive::operator<<(local_18,(Channel *)(&this->field_0x40 + (ulong)local_1c * 0x10));
  }
  SimpleArchive::operator<<(local_18,(bool)(this->mMarkTimingErrors & 1));
  SimpleArchive::operator<<(local_18,this->mEnableCycleMin);
  SimpleArchive::operator<<(local_18,this->mEnablePulseWidthMin);
  SimpleArchive::operator<<(local_18,this->mAddressSetupMin);
  SimpleArchive::operator<<(local_18,this->mAddressHoldMin);
  SimpleArchive::operator<<(local_18,this->mDataWriteSetupMin);
  SimpleArchive::operator<<(local_18,this->mDataWriteHoldMin);
  SimpleArchive::operator<<(local_18,this->mDataReadDelayMax);
  SimpleArchive::operator<<(local_18,this->mDataReadHoldMin);
  SimpleArchive::operator<<(local_18,(bool)(this->mIgnoreEPulsesWhenBusy & 1));
  SimpleArchive::operator<<(local_18,this->mBusyTimeClearHome);
  SimpleArchive::operator<<(local_18,this->mBusyTimeCmdChar);
  SimpleArchive::operator<<(local_18,(bool)(this->mStartIn4BitMode & 1));
  SimpleArchive::operator<<(local_18,(bool)(this->mDoNotGenerateBusyCheckFrames & 1));
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_18);
  return pcVar1;
}

Assistant:

const char* HD44780AnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;
    U32 dbline;

    // save settings
    text_archive << ANALYZER_SAVE_NAME;
    text_archive << ANALYZER_SAVE_VERSION;
    text_archive << mEChannel;
    text_archive << mRSChannel;
    text_archive << mRWChannel;
    for( dbline = 0; dbline < 8; dbline++ )
        text_archive << mDBChannel[ dbline ];
    text_archive << mMarkTimingErrors;
    text_archive << mEnableCycleMin;
    text_archive << mEnablePulseWidthMin;
    text_archive << mAddressSetupMin;
    text_archive << mAddressHoldMin;
    text_archive << mDataWriteSetupMin;
    text_archive << mDataWriteHoldMin;
    text_archive << mDataReadDelayMax;
    text_archive << mDataReadHoldMin;
    text_archive << mIgnoreEPulsesWhenBusy;
    text_archive << mBusyTimeClearHome;
    text_archive << mBusyTimeCmdChar;
    text_archive << mStartIn4BitMode;
    text_archive << mDoNotGenerateBusyCheckFrames;

    return SetReturnString( text_archive.GetString() );
}